

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

bool __thiscall ChebTools::ChebyshevExpansion::is_monotonic(ChebyshevExpansion *this)

{
  bool bVar1;
  bool bVar2;
  ArrayXd diff;
  VectorXd yvals;
  void *local_120 [2];
  undefined1 local_110 [24];
  Type local_f8;
  Type local_c0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_88;
  
  get_node_function_values((ChebyshevExpansion *)local_110);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<long>
            (&local_f8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_110,
             local_110._8_8_ + -1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
            (&local_c0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_110,
             local_110._8_8_ + -1);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-
            (&local_88,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&local_f8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             &local_c0);
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>const>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)local_120,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
              *)&local_88);
  local_c0.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
  super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_data =
       (PointerType)0x0;
  Eigen::ArrayBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::operator<
            ((CmpLTReturnType *)&local_f8,
             (ArrayBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_120,(Scalar *)&local_c0);
  bVar1 = Eigen::
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>
          ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
                 *)&local_f8);
  bVar2 = true;
  if (!bVar1) {
    local_110._16_8_ = 0.0;
    Eigen::ArrayBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::operator>
              ((RCmpLTReturnType *)&local_88,
               (ArrayBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_120,
               (Scalar *)(local_110 + 0x10));
    bVar2 = Eigen::
            DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
            ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                   *)&local_88);
  }
  free(local_120[0]);
  free((void *)local_110._0_8_);
  return bVar2;
}

Assistant:

bool ChebyshevExpansion::is_monotonic() const {
        auto yvals = get_node_function_values();
        auto N = yvals.size();
        Eigen::ArrayXd diff = yvals.tail(N - 1) - yvals.head(N - 1);
        return (diff < 0.0).all() || (diff > 0.0).all();
    }